

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void or(ch_compilation *comp)

{
  undefined4 local_1c;
  ch_jmpptr local_18;
  ch_op op;
  ch_dataptr patch_true;
  ch_dataptr patch_false;
  ch_compilation *comp_local;
  
  _patch_true = comp;
  op = emit_jump(comp,OP_JMP_FALSE);
  local_18 = emit_jump(_patch_true,OP_JMP);
  patch_jump(_patch_true,op);
  local_1c = 1;
  ch_emit_write(&((_patch_true->emit).emit_scope)->bytecode,&local_1c,1);
  parse(_patch_true,PREC_OR);
  patch_jump(_patch_true,local_18);
  return;
}

Assistant:

void or(ch_compilation* comp) {
  ch_dataptr patch_false = emit_jump(comp, OP_JMP_FALSE);  
  ch_dataptr patch_true = emit_jump(comp, OP_JMP); // If true, no need to evaluate the next expression
  patch_jump(comp, patch_false);
  EMIT_OP(GET_EMIT(comp), OP_POP);
  parse(comp, PREC_OR);
  patch_jump(comp, patch_true);
}